

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O0

int mtx_lock(mtx_t *mtx)

{
  int iVar1;
  mtx_t *mtx_local;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)mtx);
  return (uint)(iVar1 == 0);
}

Assistant:

int mtx_lock(mtx_t *mtx)
{
#if defined(_TTHREAD_WIN32_)
  EnterCriticalSection(&mtx->mHandle);
  if (!mtx->mRecursive)
  {
    while(mtx->mAlreadyLocked) Sleep(1000); /* Simulate deadlock... */
    mtx->mAlreadyLocked = TRUE;
  }
  return thrd_success;
#else
  return pthread_mutex_lock(mtx) == 0 ? thrd_success : thrd_error;
#endif
}